

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Statements(SQCompiler *this)

{
  SQCompiler *in_RDI;
  bool bVar1;
  bool in_stack_000000ff;
  SQCompiler *in_stack_00000100;
  
  while( true ) {
    bVar1 = false;
    if ((in_RDI->_token != 0x7d) && (bVar1 = false, in_RDI->_token != 0x12d)) {
      bVar1 = in_RDI->_token != 300;
    }
    if (!bVar1) break;
    Statement(in_stack_00000100,in_stack_000000ff);
    if (((in_RDI->_lex)._prevtoken != 0x7d) && ((in_RDI->_lex)._prevtoken != 0x3b)) {
      OptionalSemicolon(in_RDI);
    }
  }
  return;
}

Assistant:

void Statements()
    {
        while(_token != _SC('}') && _token != TK_DEFAULT && _token != TK_CASE) {
            Statement();
            if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
    }